

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O3

ItemType HN::getItemType(ItemData *itemData)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  const_iterator cVar4;
  mapped_type *pmVar5;
  ItemType IVar6;
  mapped_type strType;
  key_type local_60;
  key_type local_40;
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"type","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&itemData->_M_t,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar4._M_node == &(itemData->_M_t)._M_impl.super__Rb_tree_header) {
    IVar6 = Unknown;
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"type","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(itemData,&local_40);
    pcVar2 = (pmVar5->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar2,pcVar2 + pmVar5->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar3 == 0) {
      IVar6 = Story;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_60);
      if (iVar3 == 0) {
        IVar6 = Comment;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_60);
        if (iVar3 == 0) {
          IVar6 = Job;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_60);
          if (iVar3 == 0) {
            IVar6 = Poll;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_60);
            IVar6 = (uint)(iVar3 == 0) * 5;
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return IVar6;
}

Assistant:

ItemType getItemType(const ItemData & itemData) {
        if (itemData.find("type") == itemData.end()) return ItemType::Unknown;

        auto strType = itemData.at("type");

        if (strType == "story") return ItemType::Story;
        if (strType == "comment") return ItemType::Comment;
        if (strType == "job") return ItemType::Job;
        if (strType == "poll") return ItemType::Poll;
        if (strType == "pollopt") return ItemType::PollOpt;

        return ItemType::Unknown;
    }